

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O2

string * Limonp::trim(string *s)

{
  string *psVar1;
  
  psVar1 = rtrim(s);
  psVar1 = ltrim(psVar1);
  return psVar1;
}

Assistant:

inline std::string &trim(std::string &s) 
    {
        return ltrim(rtrim(s));
    }